

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  undefined8 uVar6;
  int *piVar7;
  type_conflict5 tVar8;
  DataKey DVar9;
  ulong uVar10;
  ulong uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  int local_18c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_150;
  ulong local_148;
  int local_13c;
  pointer local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  devexpr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar4 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar5 = (pSVar4->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_138 = (pSVar4->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_188.m_backend.fpclass = cpp_dec_float_finite;
  local_188.m_backend.prec_elem = 10;
  local_188.m_backend.data._M_elems[0] = 0;
  local_188.m_backend.data._M_elems[1] = 0;
  local_188.m_backend.data._M_elems[2] = 0;
  local_188.m_backend.data._M_elems[3] = 0;
  local_188.m_backend.data._M_elems[4] = 0;
  local_188.m_backend.data._M_elems[5] = 0;
  local_188.m_backend.data._M_elems._24_5_ = 0;
  local_188.m_backend.data._M_elems[7]._1_3_ = 0;
  local_188.m_backend.data._M_elems._32_5_ = 0;
  local_188.m_backend.data._M_elems[9]._1_3_ = 0;
  local_188.m_backend.exp = 0;
  local_188.m_backend.neg = false;
  local_18c = -1;
  uVar10 = (ulong)(uint)(pSVar4->infeasibilitiesCo).super_IdxSet.num;
  local_150 = this;
  local_130 = best;
LAB_002336b5:
  uVar11 = uVar10 & 0xffffffff;
  do {
    if ((int)uVar11 < 1) {
      if (local_18c < 0) {
        DVar9.info = 0;
        DVar9.idx = -1;
      }
      else {
        DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::id((local_150->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver,local_18c);
      }
      return (SPxId)DVar9;
    }
    iVar2 = (((local_150->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->infeasibilitiesCo).super_IdxSet.idx[uVar10 - 1];
    uVar6 = *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 0x20);
    local_188.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_188.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar5[iVar2].m_backend.data;
    local_188.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar5[iVar2].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[iVar2].m_backend.data + 0x10);
    local_188.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    local_188.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_188.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_188.m_backend.exp = pnVar5[iVar2].m_backend.exp;
    local_188.m_backend.neg = pnVar5[iVar2].m_backend.neg;
    local_188.m_backend.fpclass = pnVar5[iVar2].m_backend.fpclass;
    local_188.m_backend.prec_elem = pnVar5[iVar2].m_backend.prec_elem;
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    local_148 = uVar10 - 1;
    local_13c = iVar2;
    tVar8 = boost::multiprecision::operator<(&local_188,&result);
    if (tVar8) {
      uStack_50 = CONCAT35(local_188.m_backend.data._M_elems[7]._1_3_,
                           local_188.m_backend.data._M_elems._24_5_);
      local_68 = (devexpr  [8])local_188.m_backend.data._M_elems._0_8_;
      auStack_60[0] = local_188.m_backend.data._M_elems[2];
      auStack_60[1] = local_188.m_backend.data._M_elems[3];
      local_58[0] = local_188.m_backend.data._M_elems[4];
      local_58[1] = local_188.m_backend.data._M_elems[5];
      local_48 = CONCAT35(local_188.m_backend.data._M_elems[9]._1_3_,
                          local_188.m_backend.data._M_elems._32_5_);
      local_40 = local_188.m_backend.exp;
      local_3c = local_188.m_backend.neg;
      local_38 = local_188.m_backend.fpclass;
      iStack_34 = local_188.m_backend.prec_elem;
      local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_138[iVar2].m_backend.data;
      local_a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&local_138[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&local_138[iVar2].m_backend.data + 0x10);
      local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&local_138[iVar2].m_backend.data + 0x20);
      local_a8.m_backend.exp = local_138[iVar2].m_backend.exp;
      local_a8.m_backend.neg = local_138[iVar2].m_backend.neg;
      local_a8.m_backend.fpclass = local_138[iVar2].m_backend.fpclass;
      local_a8.m_backend.prec_elem = local_138[iVar2].m_backend.prec_elem;
      local_e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_e8.m_backend.exp = (feastol->m_backend).exp;
      local_e8.m_backend.neg = (feastol->m_backend).neg;
      local_e8.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_e8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_68,&local_a8,&local_e8,in_R8);
      local_188.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      local_188.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      local_188.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_188.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_188.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      local_188.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      local_188.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_188.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_188.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_188.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_188.m_backend.exp = result.m_backend.exp;
      local_188.m_backend.neg = result.m_backend.neg;
      local_188.m_backend.fpclass = result.m_backend.fpclass;
      local_188.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar8 = boost::multiprecision::operator>(&local_188,local_130);
      if (tVar8) break;
    }
    else {
      pSVar4 = (local_150->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar7 = (pSVar4->infeasibilitiesCo).super_IdxSet.idx;
      iVar3 = (pSVar4->infeasibilitiesCo).super_IdxSet.num;
      (pSVar4->infeasibilitiesCo).super_IdxSet.num = iVar3 + -1;
      piVar7[local_148] = piVar7[(long)iVar3 + -1];
      (pSVar4->isInfeasibleCo).data[iVar2] = 0;
    }
    uVar11 = (ulong)((int)uVar11 - 1);
    uVar10 = local_148;
  } while( true );
  *(ulong *)((local_130->m_backend).data._M_elems + 8) =
       CONCAT35(local_188.m_backend.data._M_elems[9]._1_3_,local_188.m_backend.data._M_elems._32_5_)
  ;
  *(undefined8 *)((local_130->m_backend).data._M_elems + 4) =
       local_188.m_backend.data._M_elems._16_8_;
  *(ulong *)((local_130->m_backend).data._M_elems + 6) =
       CONCAT35(local_188.m_backend.data._M_elems[7]._1_3_,local_188.m_backend.data._M_elems._24_5_)
  ;
  *(undefined8 *)(local_130->m_backend).data._M_elems = local_188.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((local_130->m_backend).data._M_elems + 2) =
       local_188.m_backend.data._M_elems._8_8_;
  (local_130->m_backend).exp = local_188.m_backend.exp;
  (local_130->m_backend).neg = local_188.m_backend.neg;
  (local_130->m_backend).fpclass = local_188.m_backend.fpclass;
  (local_130->m_backend).prec_elem = local_188.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(this->last).m_backend,&local_138[iVar2].m_backend);
  local_18c = local_13c;
  uVar10 = local_148;
  goto LAB_002336b5;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->weights.dim() == this->thesolver->test().dim());

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}